

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Error __thiscall asmjit::CodeHolder::attach(CodeHolder *this,BaseEmitter *emitter)

{
  size_type *psVar1;
  void *pvVar2;
  Error EVar3;
  Error extraout_EAX;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  CodeHolder *pCVar7;
  CodeHolder *pCVar8;
  CodeHolder *pCVar9;
  CodeHolder *pCVar10;
  long lVar11;
  
  if (emitter == (BaseEmitter *)0x0) {
    EVar3 = 2;
  }
  else if (emitter->_emitterType - 4 < 0xfffffffd) {
    EVar3 = 3;
  }
  else if (emitter->_code == (CodeHolder *)0x0) {
    EVar3 = 0;
    if ((this->_emitters).super_ZoneVectorBase._capacity ==
        (this->_emitters).super_ZoneVectorBase._size) {
      EVar3 = ZoneVectorBase::_grow(&(this->_emitters).super_ZoneVectorBase,&this->_allocator,8,1);
    }
    if ((EVar3 == 0) &&
       (pCVar7 = this, pCVar9 = (CodeHolder *)emitter, EVar3 = (*emitter->_vptr_BaseEmitter[0x10])()
       , EVar3 == 0)) {
      if (emitter->_code == this) {
        uVar4 = (this->_emitters).super_ZoneVectorBase._size;
        if (uVar4 < (this->_emitters).super_ZoneVectorBase._capacity) {
          *(BaseEmitter **)((long)(this->_emitters).super_ZoneVectorBase._data + (ulong)uVar4 * 8) =
               emitter;
          psVar1 = &(this->_emitters).super_ZoneVectorBase._size;
          *psVar1 = *psVar1 + 1;
          return 0;
        }
      }
      else {
        attach();
      }
      attach();
      if (pCVar7 == (CodeHolder *)0x0) {
        EVar3 = 2;
      }
      else {
        if ((CodeHolder *)pCVar7->_errorHandler == pCVar9) {
          if ((char)*(uint8_t *)((long)&pCVar7->_baseAddress + 1) < '\0') {
            EVar3 = 0;
            pCVar8 = pCVar7;
            pCVar10 = pCVar9;
          }
          else {
            pCVar8 = pCVar9;
            pCVar10 = pCVar7;
            EVar3 = (**(_func_int **)((long)pCVar7->_environment + 0x88))();
          }
          pvVar2 = (pCVar9->_emitters).super_ZoneVectorBase._data;
          uVar4 = (pCVar9->_emitters).super_ZoneVectorBase._size;
          uVar5 = 0xffffffff;
          if ((undefined1 *)(ulong)uVar4 != (undefined1 *)0x0) {
            pCVar8 = (CodeHolder *)0x0;
            do {
              if (*(CodeHolder **)((long)pvVar2 + (long)pCVar8 * 8) == pCVar7) {
                uVar5 = (uint)pCVar8;
                break;
              }
              pCVar8 = (CodeHolder *)&(pCVar8->_environment)._subArch;
            } while ((CodeHolder *)(ulong)uVar4 != pCVar8);
          }
          if (uVar5 == 0xffffffff) {
            detach();
          }
          else if (uVar5 < uVar4) {
            uVar4 = uVar4 - 1;
            (pCVar9->_emitters).super_ZoneVectorBase._size = uVar4;
            if (uVar4 != uVar5) {
              uVar6 = (ulong)uVar5;
              memmove((void *)((long)pvVar2 + uVar6 * 8),(void *)((long)pvVar2 + uVar6 * 8 + 8),
                      (uVar4 - uVar6) * 8);
            }
            pCVar7->_errorHandler = (ErrorHandler *)0x0;
            return EVar3;
          }
          detach();
          pCVar10->_logger = (Logger *)pCVar8;
          uVar6 = (ulong)(pCVar10->_emitters).super_ZoneVectorBase._size;
          EVar3 = extraout_EAX;
          if (uVar6 != 0) {
            pvVar2 = (pCVar10->_emitters).super_ZoneVectorBase._data;
            lVar11 = 0;
            do {
              EVar3 = (**(code **)(**(long **)((long)pvVar2 + lVar11) + 0x90))();
              lVar11 = lVar11 + 8;
            } while (uVar6 << 3 != lVar11);
          }
          return EVar3;
        }
        EVar3 = 3;
      }
      return EVar3;
    }
  }
  else {
    EVar3 = (uint)(emitter->_code != this) * 3;
  }
  return EVar3;
}

Assistant:

Error CodeHolder::attach(BaseEmitter* emitter) noexcept {
  // Catch a possible misuse of the API.
  if (ASMJIT_UNLIKELY(!emitter))
    return DebugUtils::errored(kErrorInvalidArgument);

  // Invalid emitter, this should not be possible.
  uint32_t type = emitter->emitterType();
  if (ASMJIT_UNLIKELY(type == BaseEmitter::kTypeNone || type >= BaseEmitter::kTypeCount))
    return DebugUtils::errored(kErrorInvalidState);

  // This is suspicious, but don't fail if `emitter` is already attached
  // to this code holder. This is not error, but it's not recommended.
  if (emitter->_code != nullptr) {
    if (emitter->_code == this)
      return kErrorOk;
    return DebugUtils::errored(kErrorInvalidState);
  }

  // Reserve the space now as we cannot fail after `onAttach()` succeeded.
  ASMJIT_PROPAGATE(_emitters.willGrow(&_allocator, 1));
  ASMJIT_PROPAGATE(emitter->onAttach(this));

  // Connect CodeHolder <-> BaseEmitter.
  ASMJIT_ASSERT(emitter->_code == this);
  _emitters.appendUnsafe(emitter);

  return kErrorOk;
}